

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O3

TranslatorInfo * __thiscall
helics::TranslatorFederate::getTranslatorInfo(TranslatorFederate *this,GlobalHandle gid)

{
  const_iterator cVar1;
  _Head_base<0UL,_helics::TranslatorInfo_*,_false> _Var2;
  GlobalHandle local_10;
  
  local_10 = gid;
  cVar1 = std::
          _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->translators).lookup._M_h,&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    _Var2._M_head_impl = (TranslatorInfo *)0x0;
  }
  else {
    _Var2._M_head_impl =
         *(TranslatorInfo **)
          &(this->translators).dataStorage.
           super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                            ._M_cur + 0x10)]._M_t.
           super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
    ;
  }
  return _Var2._M_head_impl;
}

Assistant:

TranslatorInfo* TranslatorFederate::getTranslatorInfo(GlobalHandle gid)
{
    return translators.find(gid);
}